

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

int64_t duckdb::DatePart::ISODayOfWeekOperator::Operation<duckdb::dtime_t,long>(dtime_t input)

{
  NotImplementedException *this;
  allocator local_39;
  string local_38 [32];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"\"time\" units \"isodow\" not recognized",&local_39);
  duckdb::NotImplementedException::NotImplementedException(this,local_38);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::ISODayOfWeekOperator::Operation(dtime_t input) {
	throw NotImplementedException("\"time\" units \"isodow\" not recognized");
}